

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O2

array<cv::RotatedRect,_10UL> *
ellipses::find_target(array<cv::RotatedRect,_10UL> *__return_storage_ptr__,Mat *img,bool debug)

{
  pointer pfVar1;
  pointer pRVar2;
  ulong uVar3;
  size_t ignored_index;
  ostream *poVar4;
  RotatedRect *e;
  pointer pRVar5;
  byte bVar6;
  long lVar7;
  array<cv::Mat,_5UL> *__return_storage_ptr___00;
  pointer this;
  array<bool,_5UL> debug_contour;
  array<bool,_5UL> agregate_contour;
  Matx<double,_4,_1> local_3a8;
  _InputArray local_380;
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  async_ellipse_process;
  int local_350;
  int local_34c;
  vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> ellipses;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  undefined4 local_300 [2];
  vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
  *local_2f8;
  undefined8 local_2f0;
  pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect> pair;
  undefined8 local_278;
  Mat pretreat;
  array<cv::Mat,_5UL> filtered_images;
  
  pretreatment(&pretreat);
  __return_storage_ptr___00 = &filtered_images;
  filter_image(__return_storage_ptr___00,&pretreat);
  agregate_contour._M_elems[4] = false;
  debug_contour._M_elems[0] = false;
  debug_contour._M_elems[1] = false;
  debug_contour._M_elems[2] = false;
  debug_contour._M_elems[3] = false;
  agregate_contour._M_elems[0] = true;
  agregate_contour._M_elems[1] = true;
  agregate_contour._M_elems[2] = true;
  agregate_contour._M_elems[3] = true;
  debug_contour._M_elems[4] = false;
  async_ellipse_process.
  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  async_ellipse_process.
  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  async_ellipse_process.
  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ::reserve(&async_ellipse_process,5);
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    if (debug_contour._M_elems[lVar7] == true) {
      local_3a8.val[0] = (double)CONCAT71(local_3a8.val[0]._1_7_,1);
      std::
      async<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>(&)(cv::Mat_const&,cv::Mat_const&,bool,bool),cv::Mat&,cv::Mat_const&,bool&,bool>
                ((launch)&pair,
                 (_func_pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_Mat_ptr_Mat_ptr_bool_bool
                  *)0x2,(Mat *)detect_circle_approach,(Mat *)__return_storage_ptr___00,(bool *)img,
                 agregate_contour._M_elems + lVar7);
      std::
      vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
      ::
      emplace_back<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>
                ((vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
                  *)&async_ellipse_process,
                 (future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
                  *)&pair);
    }
    else {
      local_3a8.val[0] = (double)((ulong)local_3a8.val[0]._1_7_ << 8);
      std::
      async<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>(&)(cv::Mat_const&,cv::Mat_const&,bool,bool),cv::Mat&,cv::Mat_const&,bool&,bool>
                ((_func_pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_Mat_ptr_Mat_ptr_bool_bool
                  *)&pair,(Mat *)detect_circle_approach,(Mat *)__return_storage_ptr___00,(bool *)img
                 ,agregate_contour._M_elems + lVar7);
      std::
      vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
      ::
      emplace_back<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>
                ((vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
                  *)&async_ellipse_process,
                 (future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
                  *)&pair);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &pair.first.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    __return_storage_ptr___00 = (array<cv::Mat,_5UL> *)&__return_storage_ptr___00->field_0x60;
  }
  ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::reserve
            (&ellipses,
             (long)async_ellipse_process.
                   super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)async_ellipse_process.
                   super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::reserve(&contours,
            (long)async_ellipse_process.
                  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)async_ellipse_process.
                  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
  pfVar1 = async_ellipse_process.
           super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this = async_ellipse_process.
              super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != pfVar1; this = this + 1) {
    std::
    future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
    ::get(&pair,this);
    if (pair.first.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        pair.first.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::emplace_back<cv::RotatedRect>
                (&ellipses,&pair.second);
      std::
      vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
      ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                  *)&contours,&pair.first);
    }
    std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
              ((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&pair);
  }
  if (debug) {
    cv::Mat::clone();
    local_380.sz.width = 0;
    local_380.sz.height = 0;
    local_2f0 = 0;
    local_380.flags = 0x3010000;
    local_300[0] = 0x8104000c;
    local_380.obj = &pair;
    local_2f8 = (vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                 *)&contours;
    cv::Matx<double,_4,_1>::Matx(&local_3a8);
    local_3a8.val[0] = 255.0;
    local_3a8.val[1] = 0.0;
    local_3a8.val[2] = 0.0;
    local_3a8.val[3] = 0.0;
    uVar3 = cv::noArray();
    local_278 = 0;
    cv::drawContours(&local_380,local_300,0xffffffffffffffff,&local_3a8,3,8,uVar3,0x7fffffff,
                     &local_278);
    pRVar2 = ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar6 = 0x20;
    for (pRVar5 = ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>.
                  _M_impl.super__Vector_impl_data._M_start; pRVar5 != pRVar2; pRVar5 = pRVar5 + 1) {
      local_380.sz.width = 0;
      local_380.sz.height = 0;
      local_380.flags = 0x3010000;
      local_350 = (int)ROUND((pRVar5->center).x);
      local_34c = (int)ROUND((pRVar5->center).y);
      local_380.obj = &pair;
      cv::Matx<double,_4,_1>::Matx(&local_3a8);
      local_3a8.val[0] = 0.0;
      local_3a8.val[1] = 0.0;
      local_3a8.val[3] = 0.0;
      uVar3 = uVar3 & 0xffffffff00000000;
      local_3a8.val[2] = (double)bVar6;
      cv::circle(&local_380,&local_350,10,(Scalar_ *)&local_3a8,6,8,uVar3);
      local_380.sz.width = 0;
      local_380.sz.height = 0;
      local_380.flags = 0x3010000;
      local_380.obj = &pair;
      cv::Matx<double,_4,_1>::Matx(&local_3a8);
      local_3a8.val[0] = 0.0;
      local_3a8.val[1] = 255.0;
      local_3a8.val[2] = 0.0;
      local_3a8.val[3] = 0.0;
      cv::ellipse((_InputOutputArray *)&local_380,pRVar5,(Scalar_ *)&local_3a8,3,8);
      bVar6 = bVar6 + 0x20;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"Output",(allocator<char> *)&local_380);
    cv::namedWindow((string *)&local_3a8,0);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"Output",(allocator<char> *)local_300);
    local_380.sz.width = 0;
    local_380.sz.height = 0;
    local_380.flags = 0x1010000;
    local_380.obj = &pair;
    cv::imshow((string *)&local_3a8,&local_380);
    std::__cxx11::string::~string((string *)&local_3a8);
    cv::waitKey(0);
    cv::destroyAllWindows();
    cv::Mat::~Mat((Mat *)&pair);
  }
  ignored_index = find_weakest_element(&ellipses);
  if (debug) {
    poVar4 = std::operator<<((ostream *)&std::cout,"weakest ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,'\n');
  }
  pair.first.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       *(pointer *)
        &(ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
          super__Vector_impl_data._M_start)->center;
  pair.first.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       *(pointer *)
        &(ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
          super__Vector_impl_data._M_start)->size;
  pair.first.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       *(pointer *)
        &(ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
          super__Vector_impl_data._M_start)->angle;
  pair.second.center =
       *(Point2f *)
        &ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
         super__Vector_impl_data._M_start[1].center.y;
  pair.second.size =
       *(Size2f *)
        &ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
         super__Vector_impl_data._M_start[1].size.height;
  pair._40_8_ = ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>.
                _M_impl.super__Vector_impl_data._M_start[2].center;
  compute_final_ellipses_by_linear_interpolation
            (__return_storage_ptr__,(array<cv::RotatedRect,_3UL> *)&pair,ignored_index);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&contours);
  std::_Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::~_Vector_base
            (&ellipses.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>);
  std::
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ::~vector(&async_ellipse_process);
  std::array<cv::Mat,_5UL>::~array(&filtered_images);
  cv::Mat::~Mat(&pretreat);
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::RotatedRect, 10> find_target(const cv::Mat& img, bool debug)
{
    cv::Mat pretreat = pretreatment(img);
    std::array<cv::Mat, 5> filtered_images = filter_image(pretreat);
    std::array<bool, 5> agregate_contour {true, true, true, true, false};
    std::array<bool, 5> debug_contour {false, false, false, false, false};

    std::vector<std::future<std::pair<std::vector<cv::Point>, cv::RotatedRect>>> async_ellipse_process;
    async_ellipse_process.reserve(filtered_images.size());
    for(std::size_t i = 0; i < 3; i++)
    {
        if(debug_contour[i])
        {
            async_ellipse_process.emplace_back(std::async(
                std::launch::deferred, detect_circle_approach, filtered_images[i], img, agregate_contour[i], true));
        }
        else
        {
            async_ellipse_process.emplace_back(
                std::async(detect_circle_approach, filtered_images[i], img, agregate_contour[i], false));
        }
    }

    std::vector<cv::RotatedRect> ellipses;
    std::vector<std::vector<cv::Point>> contours;
    ellipses.reserve(async_ellipse_process.size());
    contours.reserve(async_ellipse_process.size());
    for(auto& async_p : async_ellipse_process)
    {
        auto pair = async_p.get();
        if(pair.first.size())
        {
            ellipses.emplace_back(std::move(pair.second));
            contours.emplace_back(std::move(pair.first));
        }
    }

    if(debug)
    {
        auto tmp = img.clone();
        cv::drawContours(tmp, contours, -1, cv::Scalar(255, 0, 0), 3);
        unsigned char shade = 32;
        for(const auto& e : ellipses)
        {
            cv::circle(tmp, e.center, 10, cv::Scalar(0, 0, shade), 6);
            cv::ellipse(tmp, e, cv::Scalar(0, 255, 0), 3);
            shade += 32;
        }

        cv::namedWindow("Output", cv::WINDOW_NORMAL);
        cv::imshow("Output", tmp);
        cv::waitKey(0);
        cv::destroyAllWindows();
    }

    auto value = find_weakest_element(ellipses);

    if(debug)
    {
        std::cout << "weakest " << value << '\n';
    }

    return compute_final_ellipses_by_linear_interpolation({ellipses[0], ellipses[1], ellipses[2]}, value);
}